

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

Rational128 * __thiscall
btConvexHullInternal::Vertex::dot(Rational128 *__return_storage_ptr__,Vertex *this,Point64 *b)

{
  int64_t value;
  ulong uVar1;
  Int128 IVar2;
  Int128 IVar3;
  ulong local_50;
  uint64_t local_48;
  Int128 local_40;
  
  if ((this->point).index < 0) {
    IVar2 = Int128::operator*(&(this->point128).x,b->x);
    IVar3 = Int128::operator*(&(this->point128).y,b->y);
    local_50 = IVar2.low;
    uVar1 = IVar3.low + local_50;
    local_48 = IVar2.high;
    IVar2 = Int128::operator*(&(this->point128).z,b->z);
    local_40.low = IVar2.low + uVar1;
    local_40.high =
         IVar2.high + IVar3.high + local_48 + (ulong)CARRY8(IVar3.low,local_50) +
         (ulong)CARRY8(IVar2.low,uVar1);
    Rational128::Rational128(__return_storage_ptr__,&local_40,&(this->point128).denominator);
  }
  else {
    value = Point32::dot(&this->point,b);
    Rational128::Rational128(__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

Rational128 dot(const Point64& b) const
				{
					return (point.index >= 0) ? Rational128(point.dot(b))
						: Rational128(point128.x * b.x + point128.y * b.y + point128.z * b.z, point128.denominator);
				}